

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::unfix_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDX;
  uint in_ESI;
  DaTrie<false,_false,_false> *in_RDI;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffc8;
  uint uVar6;
  uint32_t in_stack_ffffffffffffffcc;
  uint local_1c;
  
  sVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(&in_RDI->bc_);
  if (sVar3 <= in_ESI) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x449,
                  "void ddd::DaTrie<false, false, false>::unfix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar4);
  if (bVar1) {
    local_1c = in_ESI >> 8;
    if (in_RDI->bc_emps_ == 0) {
      set_next_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      set_prev_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      in_RDI->head_pos_ = in_ESI;
    }
    else {
      uVar6 = in_ESI;
      prev_(in_RDI,in_ESI);
      set_prev_(in_RDI,uVar6,in_stack_ffffffffffffffc8);
      set_next_(in_RDI,uVar6,in_stack_ffffffffffffffc8);
      prev_(in_RDI,uVar6);
      set_next_(in_RDI,uVar6,in_stack_ffffffffffffffc8);
      set_prev_(in_RDI,uVar6,in_stack_ffffffffffffffc8);
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)in_ESI);
    Bc::unfix(pvVar4);
    in_RDI->bc_emps_ = in_RDI->bc_emps_ + 1;
    pvVar5 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                       (in_RDX,(ulong)local_1c);
    pvVar5->num_emps = pvVar5->num_emps + 1;
    uVar6 = local_1c;
    uVar2 = num_blocks((DaTrie<false,_false,_false> *)0x15e021);
    if (uVar6 == uVar2 - 1) {
      while (pvVar5 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                                (in_RDX,(ulong)local_1c), pvVar5->num_emps == 0x100) {
        pop_block_(in_RDI);
        uVar2 = num_blocks((DaTrie<false,_false,_false> *)0x15e05b);
        if (uVar2 == 0) {
          return;
        }
        local_1c = local_1c - 1;
      }
    }
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x44a,
                "void ddd::DaTrie<false, false, false>::unfix_(uint32_t, std::vector<Block> &) [WithBLM = false, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<Block>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (bc_emps_ == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      head_pos_ = node_pos;
    } else {
      set_prev_(node_pos, prev_(head_pos_));
      set_next_(node_pos, head_pos_);
      set_next_(prev_(head_pos_), node_pos);
      set_prev_(head_pos_, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }